

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int running;
  int maxfd;
  double connect_time;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1e8;
  int local_1e4;
  undefined8 local_1e0;
  double local_1d8;
  double local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1e8 = 1;
  local_1d0 = 0.0;
  local_1d8 = 1.0;
  do {
    local_1d8 = local_1d8 * 0.5;
  } while (1.0 < local_1d8 * 0.5 + 1.0);
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                  ,0x33,iVar2,uVar4);
  }
  if (iVar2 != 0) goto LAB_001024a6;
  lVar5 = curl_easy_init();
  iVar2 = 0;
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                  ,0x35);
    iVar2 = 0x7c;
  }
  lVar6 = 0;
  if (lVar5 != 0) {
    iVar3 = curl_easy_setopt(lVar5,0x2a,1);
    uVar1 = _stderr;
    iVar2 = 0;
    if (iVar3 != 0) {
      uVar4 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                    ,0x37,iVar3,uVar4);
      iVar2 = iVar3;
    }
    if (iVar2 == 0) {
      iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                      ,0x38,iVar3,uVar4);
        iVar2 = iVar3;
      }
      lVar6 = 0;
      if (iVar2 == 0) {
        libtest_debug_config.tracetime = 1;
        libtest_debug_config.nohex = 1;
        iVar3 = curl_easy_setopt(lVar5,0x276f);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                        ,0x3c,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 != 0) goto LAB_00102427;
        iVar3 = curl_easy_setopt(lVar5,0x4e7e,libtest_debug_cb);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                        ,0x3d,iVar3,uVar4);
          iVar2 = iVar3;
        }
        lVar6 = 0;
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,0x29,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                          ,0x3e,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 != 0) goto LAB_00102427;
          lVar6 = curl_multi_init();
          if (lVar6 == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                          ,0x40);
            iVar2 = 0x7b;
          }
          else {
            iVar2 = curl_multi_add_handle(lVar6,lVar5);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              iVar2 = 0;
            }
            else {
              uVar4 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                            ,0x42,iVar2,uVar4);
            }
            if (iVar2 == 0) {
              iVar2 = 0;
              do {
                if (local_1e8 == 0) goto LAB_00102a0c;
                local_1e4 = -99;
                local_1c8.tv_sec = 0;
                local_1c8.tv_usec = 100000;
                iVar3 = curl_multi_perform(lVar6,&local_1e8);
                uVar1 = _stderr;
                if (iVar3 == 0) {
                  if (local_1e8 < 0) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                  ,0x4c);
                    iVar2 = 0x7a;
                  }
                }
                else {
                  uVar4 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                ,0x4c,iVar3,uVar4);
                  iVar2 = iVar3;
                }
                iVar3 = 0xe;
                if (iVar2 == 0) {
                  tVar10 = tutil_tvnow();
                  lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                  if (lVar7 < 0xea61) {
                    if (local_1e8 == 0) {
                      iVar2 = 0;
                      iVar3 = 0x2c;
                    }
                    else {
                      local_b8.__fds_bits[0xe] = 0;
                      local_b8.__fds_bits[0xf] = 0;
                      local_b8.__fds_bits[0xc] = 0;
                      local_b8.__fds_bits[0xd] = 0;
                      local_b8.__fds_bits[10] = 0;
                      local_b8.__fds_bits[0xb] = 0;
                      local_b8.__fds_bits[8] = 0;
                      local_b8.__fds_bits[9] = 0;
                      local_b8.__fds_bits[6] = 0;
                      local_b8.__fds_bits[7] = 0;
                      local_b8.__fds_bits[4] = 0;
                      local_b8.__fds_bits[5] = 0;
                      local_b8.__fds_bits[2] = 0;
                      local_b8.__fds_bits[3] = 0;
                      local_b8.__fds_bits[0] = 0;
                      local_b8.__fds_bits[1] = 0;
                      local_138.__fds_bits[0] = 0;
                      local_138.__fds_bits[1] = 0;
                      local_138.__fds_bits[2] = 0;
                      local_138.__fds_bits[3] = 0;
                      local_138.__fds_bits[4] = 0;
                      local_138.__fds_bits[5] = 0;
                      local_138.__fds_bits[6] = 0;
                      local_138.__fds_bits[7] = 0;
                      local_138.__fds_bits[8] = 0;
                      local_138.__fds_bits[9] = 0;
                      local_138.__fds_bits[10] = 0;
                      local_138.__fds_bits[0xb] = 0;
                      local_138.__fds_bits[0xc] = 0;
                      local_138.__fds_bits[0xd] = 0;
                      local_138.__fds_bits[0xe] = 0;
                      local_138.__fds_bits[0xf] = 0;
                      local_1b8.__fds_bits[0] = 0;
                      local_1b8.__fds_bits[1] = 0;
                      local_1b8.__fds_bits[2] = 0;
                      local_1b8.__fds_bits[3] = 0;
                      local_1b8.__fds_bits[4] = 0;
                      local_1b8.__fds_bits[5] = 0;
                      local_1b8.__fds_bits[6] = 0;
                      local_1b8.__fds_bits[7] = 0;
                      local_1b8.__fds_bits[8] = 0;
                      local_1b8.__fds_bits[9] = 0;
                      local_1b8.__fds_bits[10] = 0;
                      local_1b8.__fds_bits[0xb] = 0;
                      local_1b8.__fds_bits[0xc] = 0;
                      local_1b8.__fds_bits[0xd] = 0;
                      local_1b8.__fds_bits[0xe] = 0;
                      local_1b8.__fds_bits[0xf] = 0;
                      iVar2 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1e4);
                      uVar1 = _stderr;
                      if (iVar2 == 0) {
                        iVar2 = 0;
                        if (local_1e4 < -1) {
                          curl_mfprintf(_stderr,
                                        "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                        ,0x57);
                          iVar2 = 0x7a;
                        }
                      }
                      else {
                        uVar4 = curl_multi_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                      ,0x57,iVar2,uVar4);
                      }
                      if (iVar2 == 0) {
                        iVar2 = select_wrapper(local_1e4 + 1,&local_b8,&local_138,&local_1b8,
                                               &local_1c8);
                        if (iVar2 == -1) {
                          piVar8 = __errno_location();
                          iVar2 = *piVar8;
                          local_1e0 = _stderr;
                          pcVar9 = strerror(iVar2);
                          curl_mfprintf(local_1e0,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                        ,0x5b,iVar2,pcVar9);
                          iVar2 = 0x79;
                        }
                        else {
                          tVar10 = tutil_tvnow();
                          lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                          iVar3 = 0;
                          iVar2 = 0;
                          if (60000 < lVar7) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                          ,0x5d);
                            iVar2 = 0x7d;
                            iVar3 = 0xe;
                          }
                        }
                      }
                    }
                  }
                  else {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/tests/libtest/lib573.c"
                                  ,0x4e);
                    iVar2 = 0x7d;
                  }
                }
              } while (iVar3 == 0);
              if (iVar3 != 0xe) {
                if (iVar3 != 0x2c) goto LAB_001024a6;
LAB_00102a0c:
                curl_easy_getinfo(lVar5,0x300005,&local_1d0);
                if (local_1d0 < local_1d8) {
                  curl_mfprintf(_stderr,"connect time %e is < epsilon %e\n");
                  iVar2 = 0x7e;
                }
              }
            }
          }
        }
      }
    }
    else {
LAB_00102427:
      lVar6 = 0;
    }
  }
  curl_multi_remove_handle(lVar6,lVar5);
  curl_multi_cleanup(lVar6);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
LAB_001024a6:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while(running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if(connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time %e is < epsilon %e\n",
            connect_time, dbl_epsilon);
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}